

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void rebuildPage(MemPage *pPg,int nCell,u8 **apCell,u16 *szCell)

{
  u32 uVar1;
  u8 *puVar2;
  u8 *puVar3;
  char *pcVar4;
  u8 *puVar5;
  u8 uVar6;
  ushort uVar7;
  ulong uVar8;
  ulong uVar9;
  u8 *__src;
  u8 *__dest;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = (ulong)pPg->hdrOffset;
  puVar2 = pPg->aData;
  uVar1 = pPg->pBt->usableSize;
  uVar8 = (ulong)(int)uVar1;
  puVar3 = pPg->aCellIdx;
  pcVar4 = pPg->pBt->pPager->pTmpSpace;
  uVar7 = *(ushort *)(puVar2 + uVar11 + 5) << 8 | *(ushort *)(puVar2 + uVar11 + 5) >> 8;
  memcpy(pcVar4 + uVar7,puVar2 + uVar7,(long)(int)(uVar1 - uVar7));
  if (nCell < 1) {
    uVar6 = (u8)(uVar1 >> 8);
  }
  else {
    uVar10 = 0;
    __dest = puVar2 + uVar8;
    do {
      puVar5 = apCell[uVar10];
      __src = puVar5 + ((long)pcVar4 - (long)puVar2);
      if (puVar2 + uVar8 <= puVar5) {
        __src = puVar5;
      }
      if (puVar5 <= puVar2) {
        __src = puVar5;
      }
      __dest = __dest + -(ulong)szCell[uVar10];
      memcpy(__dest,__src,(ulong)szCell[uVar10]);
      uVar9 = (long)__dest - (long)puVar2;
      *(ushort *)(puVar3 + uVar10 * 2) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
      uVar10 = uVar10 + 1;
    } while ((uint)nCell != uVar10);
    uVar6 = (u8)(uVar9 >> 8);
    uVar8 = uVar9 & 0xffffffff;
  }
  pPg->nCell = (u16)nCell;
  pPg->nOverflow = '\0';
  (puVar2 + uVar11 + 1)[0] = '\0';
  (puVar2 + uVar11 + 1)[1] = '\0';
  puVar2[uVar11 + 3] = *(u8 *)((long)&pPg->nCell + 1);
  puVar2[uVar11 + 4] = (u8)pPg->nCell;
  puVar2[uVar11 + 5] = uVar6;
  puVar2[uVar11 + 6] = (u8)uVar8;
  puVar2[uVar11 + 7] = '\0';
  return;
}

Assistant:

static void rebuildPage(
  MemPage *pPg,                   /* Edit this page */
  int nCell,                      /* Final number of cells on page */
  u8 **apCell,                    /* Array of cells */
  u16 *szCell                     /* Array of cell sizes */
){
  const int hdr = pPg->hdrOffset;          /* Offset of header on pPg */
  u8 * const aData = pPg->aData;           /* Pointer to data for pPg */
  const int usableSize = pPg->pBt->usableSize;
  u8 * const pEnd = &aData[usableSize];
  int i;
  u8 *pCellptr = pPg->aCellIdx;
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  u8 *pData;

  i = get2byte(&aData[hdr+5]);
  memcpy(&pTmp[i], &aData[i], usableSize - i);

  pData = pEnd;
  for(i=0; i<nCell; i++){
    u8 *pCell = apCell[i];
    if( pCell>aData && pCell<pEnd ){
      pCell = &pTmp[pCell - aData];
    }
    pData -= szCell[i];
    memcpy(pData, pCell, szCell[i]);
    put2byte(pCellptr, (pData - aData));
    pCellptr += 2;
    assert( szCell[i]==cellSizePtr(pPg, pCell) );
  }

  /* The pPg->nFree field is now set incorrectly. The caller will fix it. */
  pPg->nCell = nCell;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+1], 0);
  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);
  aData[hdr+7] = 0x00;
}